

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

bool IsHit(bitset<32UL> flags)

{
  long lVar1;
  bool bVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (t_assoc == direct_mapped) {
    j = 0;
    uVar5 = (ulong)(uint)bit_block;
    if ((ulong)bit_line == 0) {
      current_line = 0;
      i = uVar5;
    }
    else {
      i = bit_line + uVar5;
      current_line = 0;
      j = 0;
      do {
        uVar6 = current_line & ~(1L << (j & 0x3f));
        current_line = current_line | 1L << (j & 0x3f);
        if (((ulong)flags.super__Base_bitset<1UL>._M_w >> ((ulong)((uint)bit_block + (int)j) & 0x3f)
            & 1) == 0) {
          current_line = uVar6;
        }
        lVar1 = uVar5 + j;
        j = j + 1;
      } while (lVar1 + 1U < i);
    }
    uVar5 = cache_item[current_line].super__Base_bitset<1UL>._M_w;
    if (((uint)uVar5 >> 0x1e & 1) != 0) {
      i = 0x1f;
      uVar6 = 0x1f - (ulong)bit_tag;
      if (0x1e < uVar6) {
        i = 0x1f;
        j = 0x1c;
        return true;
      }
      uVar4 = 0x1c;
      do {
        bVar2 = ((uVar5 >> (uVar4 & 0x3f) & 1) != 0) !=
                (((ulong)flags.super__Base_bitset<1UL>._M_w >>
                  ((ulong)((int)uVar4 + 3U & 0xff) & 0x3f) & 1) != 0);
        j = uVar4;
        if (bVar2) break;
        i = uVar4 + 2;
        uVar4 = uVar4 - 1;
        j = 0x1c - (ulong)bit_tag;
      } while (uVar6 < i);
      return !bVar2;
    }
  }
  else if (t_assoc == set_associative) {
    j = 0;
    uVar5 = (ulong)(uint)bit_block;
    if ((ulong)bit_set == 0) {
      current_set = 0;
      i = uVar5;
    }
    else {
      i = bit_set + uVar5;
      current_set = 0;
      j = 0;
      do {
        uVar6 = current_set & ~(1L << (j & 0x3f));
        current_set = current_set | 1L << (j & 0x3f);
        if (((ulong)flags.super__Base_bitset<1UL>._M_w >> ((ulong)((uint)bit_block + (int)j) & 0x3f)
            & 1) == 0) {
          current_set = uVar6;
        }
        lVar1 = uVar5 + j;
        j = j + 1;
      } while (lVar1 + 1U < i);
    }
    uVar3 = i_cache_set * current_set;
    uVar5 = (current_set + 1) * i_cache_set;
    temp = uVar3;
    if (uVar3 < uVar5) {
      uVar6 = 0x1f - (ulong)bit_tag;
      do {
        uVar4 = cache_item[uVar3].super__Base_bitset<1UL>._M_w;
        if (((uint)uVar4 >> 0x1e & 1) != 0) {
          i = 0x1f;
          if (0x1e < uVar6) {
            current_line = uVar3;
            i = 0x1f;
            j = 0x1c;
            temp = uVar3;
            return true;
          }
          j = 0x1c;
          while (((uVar4 >> (j & 0x3f) & 1) != 0) ==
                 (((ulong)flags.super__Base_bitset<1UL>._M_w >> ((ulong)((int)j + 3U & 0xff) & 0x3f)
                  & 1) != 0)) {
            i = j + 2;
            j = j - 1;
            if (i <= uVar6) {
              current_line = uVar3;
              j = 0x1c - (ulong)bit_tag;
              temp = uVar3;
              return true;
            }
          }
        }
        uVar3 = uVar3 + 1;
        temp = uVar5;
      } while (uVar3 != uVar5);
    }
  }
  else if (t_assoc == full_associative) {
    if (i_num_line != 0) {
      uVar5 = 0x1f - (ulong)bit_tag;
      temp = 0;
      do {
        uVar6 = cache_item[temp].super__Base_bitset<1UL>._M_w;
        if (((uint)uVar6 >> 0x1e & 1) != 0) {
          i = 0x1f;
          if (0x1e < uVar5) {
            current_line = temp;
            i = 0x1f;
            j = 0x1c;
            return true;
          }
          j = 0x1c;
          while (((uVar6 >> (j & 0x3f) & 1) != 0) ==
                 (((ulong)flags.super__Base_bitset<1UL>._M_w >> ((ulong)((int)j + 3U & 0xff) & 0x3f)
                  & 1) != 0)) {
            i = j + 2;
            j = j - 1;
            if (i <= uVar5) {
              current_line = temp;
              j = 0x1c - (ulong)bit_tag;
              return true;
            }
          }
        }
        temp = temp + 1;
      } while (temp != i_num_line);
    }
    temp = i_num_line;
  }
  return false;
}

Assistant:

bool IsHit(bitset<32> flags)
{
    bool ret = false;

    if(t_assoc == direct_mapped)
    {
        bitset<32> flags_line; // a temp variable

        for(j=0,i=(bit_block); i<(bit_block+bit_line); j++,i++) //判断在cache多少行
        {
            flags_line[j] = flags[i];
        }

        current_line = flags_line.to_ulong();
        assert(cache_item[current_line][31] == true);

        if(cache_item[current_line][30]) //判断hit位是否为真
        {
            ret = true;

            for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
            {
                if(flags[i] != cache_item[current_line][j])
                {
                    ret = false;
                    break;
                }
            }
        }
    }
    else if(t_assoc == full_associative)
    {
        for(temp=0; temp<i_num_line; temp++)
        {
            if(cache_item[temp][30]) //判断hit位是否为真
            {
                ret = true;

                for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
                {
                    if(flags[i] != cache_item[temp][j])
                    {
                        ret = false;
                        break;
                    }
                }
            }

            if(ret)
            {
                current_line = temp;
                break;
            }
        }
    }
    else if(t_assoc == set_associative)
    {
        bitset<32> flags_set;

        for(j=0,i=(bit_block); i<(bit_block+bit_set); j++,i++) //判断在cache多少组
        {
            flags_set[j] = flags[i];
        }

        current_set = flags_set.to_ulong();

        for(temp=(current_set*i_cache_set); temp<((current_set+1)*i_cache_set); temp++)
        {
            if(cache_item[temp][30]) //判断hit位是否为真
            {
                ret = true;

                for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
                {
                    if(flags[i] != cache_item[temp][j])
                    {
                        ret = false;
                        break;
                    }
                }
            }

            if(ret)
            {
                current_line = temp;
                break;
            }
        }
    }

    return ret;
}